

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O0

void __thiscall FTextureManager::LoadTextureDefs(FTextureManager *this,int wadnum,char *lumpname)

{
  FTexture *this_00;
  BYTE BVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int fitheight;
  FTextureID *pFVar5;
  TextureHash *pTVar6;
  FTexture *this_01;
  char *pcVar7;
  FTextureID local_1bc;
  FTexture *pFStack_1b8;
  FTextureID oldtex_1;
  FTexture *newtex_1;
  int lumpnum_1;
  FString local_1a0;
  FString base;
  FTexture *newtex;
  int sl;
  FTexture *oldtex;
  uint i;
  int lumpnum;
  FName texname;
  int amount;
  FScanner sc;
  undefined1 local_58 [8];
  TArray<FTextureID,_FTextureID> tlist;
  int mode;
  int type;
  int height;
  int width;
  bool is32bit;
  FString src;
  int lastLump;
  int remapLump;
  char *lumpname_local;
  int wadnum_local;
  FTextureManager *this_local;
  
  FString::FString((FString *)&width);
  TArray<FTextureID,_FTextureID>::TArray((TArray<FTextureID,_FTextureID> *)local_58);
  src.Chars._0_4_ = 0;
  while (src.Chars._4_4_ = FWadCollection::FindLump(&Wads,lumpname,(int *)&src,false),
        src.Chars._4_4_ != -1) {
    iVar3 = FWadCollection::GetLumpFile(&Wads,src.Chars._4_4_);
    if (iVar3 == wadnum) {
      FScanner::FScanner((FScanner *)&texname,src.Chars._4_4_);
      while (bVar2 = FScanner::GetString((FScanner *)&texname), bVar2) {
        bVar2 = FScanner::Compare((FScanner *)&texname,"remap");
        if (bVar2) {
          FScanner::MustGetString((FScanner *)&texname);
          bVar2 = FScanner::Compare((FScanner *)&texname,"wall");
          if (bVar2) {
            BVar1 = '\x01';
            tlist.Count = 2;
          }
          else {
            bVar2 = FScanner::Compare((FScanner *)&texname,"flat");
            if (bVar2) {
              BVar1 = '\x02';
              tlist.Count = 2;
            }
            else {
              bVar2 = FScanner::Compare((FScanner *)&texname,"sprite");
              if (bVar2) {
                BVar1 = '\x03';
              }
              else {
                BVar1 = '\0';
              }
              tlist.Count = 0;
            }
          }
          if (BVar1 != '\0') {
            FScanner::MustGetString((FScanner *)&texname);
          }
          _texname[8] = '\0';
          TArray<FTextureID,_FTextureID>::Clear((TArray<FTextureID,_FTextureID> *)local_58);
          lumpnum = ListTextures(this,_texname,(TArray<FTextureID,_FTextureID> *)local_58);
          FName::FName((FName *)&i,_texname);
          FScanner::MustGetString((FScanner *)&texname);
          oldtex._4_4_ = FWadCollection::CheckNumForFullName(&Wads,_texname,true,0xe);
          if (oldtex._4_4_ == -1) {
            oldtex._4_4_ = FWadCollection::CheckNumForFullName(&Wads,_texname,true,0xf);
          }
          uVar4 = TArray<FTextureID,_FTextureID>::Size((TArray<FTextureID,_FTextureID> *)local_58);
          if (uVar4 == 0) {
            pcVar7 = FName::GetChars((FName *)&i);
            Printf("Attempting to remap non-existent texture %s to %s\n",pcVar7,_texname);
          }
          else if (oldtex._4_4_ == -1) {
            pcVar7 = FName::GetChars((FName *)&i);
            Printf("Attempting to remap texture %s to non-existent lump %s\n",pcVar7,_texname);
          }
          else {
            for (oldtex._0_4_ = 0;
                uVar4 = TArray<FTextureID,_FTextureID>::Size
                                  ((TArray<FTextureID,_FTextureID> *)local_58), (uint)oldtex < uVar4
                ; oldtex._0_4_ = (uint)oldtex + 1) {
              pFVar5 = TArray<FTextureID,_FTextureID>::operator[]
                                 ((TArray<FTextureID,_FTextureID> *)local_58,(ulong)(uint)oldtex);
              iVar3 = FTextureID::GetIndex(pFVar5);
              pTVar6 = TArray<FTextureManager::TextureHash,_FTextureManager::TextureHash>::
                       operator[](&this->Textures,(long)iVar3);
              this_00 = pTVar6->Texture;
              if (((((this_00->UseType == BVar1) || (BVar1 == '\0')) ||
                   ((tlist.Count == 2 && (this_00->UseType == '\n')))) ||
                  ((((BVar1 == '\x03' && (this_00->UseType == '\b')) &&
                    (iVar3 = (*this_00->_vptr_FTexture[6])(), -1 < iVar3)) &&
                   (iVar3 = FWadCollection::GetLumpNamespace(&Wads,iVar3), iVar3 == 1)))) &&
                 (this_01 = FTexture::CreateTexture(oldtex._4_4_,0), this_01 != (FTexture *)0x0)) {
                *(ushort *)&this_01->field_0x31 = *(ushort *)&this_01->field_0x31 | 4;
                iVar3 = FTexture::GetScaledWidth(this_00);
                fitheight = FTexture::GetScaledHeight(this_00);
                FTexture::SetScaledSize(this_01,iVar3,fitheight);
                iVar3 = FTexture::GetScaledLeftOffset(this_00);
                this_01->LeftOffset = (SWORD)(int)((double)iVar3 * (this_01->Scale).X);
                iVar3 = FTexture::GetScaledTopOffset(this_00);
                this_01->TopOffset = (SWORD)(int)((double)iVar3 * (this_01->Scale).Y);
                pFVar5 = TArray<FTextureID,_FTextureID>::operator[]
                                   ((TArray<FTextureID,_FTextureID> *)local_58,(ulong)(uint)oldtex);
                base.Chars._4_4_ = pFVar5->texnum;
                ReplaceTexture(this,base.Chars._4_4_,this_01,true);
              }
            }
          }
        }
        else {
          bVar2 = FScanner::Compare((FScanner *)&texname,"define");
          if (bVar2) {
            FScanner::GetString((FScanner *)&texname);
            ExtractFileBase((char *)&local_1a0,SUB81(_texname,0));
            bVar2 = FString::IsEmpty(&local_1a0);
            if (!bVar2) {
              FString::Left((FString *)&stack0xfffffffffffffe58,(size_t)&local_1a0);
              FString::operator=((FString *)&width,(FString *)&stack0xfffffffffffffe58);
              FString::~FString((FString *)&stack0xfffffffffffffe58);
              newtex_1._4_4_ = FWadCollection::CheckNumForFullName(&Wads,_texname,true,0xe);
              if (newtex_1._4_4_ == -1) {
                newtex_1._4_4_ = FWadCollection::CheckNumForFullName(&Wads,_texname,true,0xf);
              }
              FScanner::GetString((FScanner *)&texname);
              bVar2 = FScanner::Compare((FScanner *)&texname,"force32bit");
              if (!bVar2) {
                FScanner::UnGet((FScanner *)&texname);
              }
              FScanner::GetNumber((FScanner *)&texname);
              FScanner::GetNumber((FScanner *)&texname);
              if ((-1 < newtex_1._4_4_) &&
                 (pFStack_1b8 = FTexture::CreateTexture(newtex_1._4_4_,10),
                 pFStack_1b8 != (FTexture *)0x0)) {
                *(ushort *)&pFStack_1b8->field_0x31 = *(ushort *)&pFStack_1b8->field_0x31 | 4;
                FTexture::SetScaledSize(pFStack_1b8,sc.StringLen,sc.StringLen);
                FString::operator=(&pFStack_1b8->Name,(FString *)&width);
                pcVar7 = FString::operator_cast_to_char_((FString *)&width);
                local_1bc = CheckForTexture(&TexMan,pcVar7,8,1);
                bVar2 = FTextureID::isValid(&local_1bc);
                if (bVar2) {
                  ReplaceTexture(this,local_1bc,pFStack_1b8,true);
                  pFStack_1b8->UseType = '\n';
                }
                else {
                  AddTexture(this,pFStack_1b8);
                }
              }
            }
            FString::~FString(&local_1a0);
          }
          else {
            bVar2 = FScanner::Compare((FScanner *)&texname,"texture");
            if (bVar2) {
              ParseXTexture(this,(FScanner *)&texname,10);
            }
            else {
              bVar2 = FScanner::Compare((FScanner *)&texname,"sprite");
              if (bVar2) {
                ParseXTexture(this,(FScanner *)&texname,3);
              }
              else {
                bVar2 = FScanner::Compare((FScanner *)&texname,"walltexture");
                if (bVar2) {
                  ParseXTexture(this,(FScanner *)&texname,1);
                }
                else {
                  bVar2 = FScanner::Compare((FScanner *)&texname,"flat");
                  if (bVar2) {
                    ParseXTexture(this,(FScanner *)&texname,2);
                  }
                  else {
                    bVar2 = FScanner::Compare((FScanner *)&texname,"graphic");
                    if (bVar2) {
                      ParseXTexture(this,(FScanner *)&texname,8);
                    }
                    else {
                      FScanner::ScriptError
                                ((FScanner *)&texname,"Texture definition expected, found \'%s\'",
                                 _texname);
                    }
                  }
                }
              }
            }
          }
        }
      }
      FScanner::~FScanner((FScanner *)&texname);
    }
  }
  TArray<FTextureID,_FTextureID>::~TArray((TArray<FTextureID,_FTextureID> *)local_58);
  FString::~FString((FString *)&width);
  return;
}

Assistant:

void FTextureManager::LoadTextureDefs(int wadnum, const char *lumpname)
{
	int remapLump, lastLump;
	FString src;
	bool is32bit;
	int width, height;
	int type, mode;
	TArray<FTextureID> tlist;

	lastLump = 0;

	while ((remapLump = Wads.FindLump(lumpname, &lastLump)) != -1)
	{
		if (Wads.GetLumpFile(remapLump) == wadnum)
		{
			FScanner sc(remapLump);
			while (sc.GetString())
			{
				if (sc.Compare("remap")) // remap an existing texture
				{
					sc.MustGetString();

					// allow selection by type
					if (sc.Compare("wall")) type=FTexture::TEX_Wall, mode=FTextureManager::TEXMAN_Overridable;
					else if (sc.Compare("flat")) type=FTexture::TEX_Flat, mode=FTextureManager::TEXMAN_Overridable;
					else if (sc.Compare("sprite")) type=FTexture::TEX_Sprite, mode=0;
					else type = FTexture::TEX_Any, mode = 0;

					if (type != FTexture::TEX_Any) sc.MustGetString();

					sc.String[8]=0;

					tlist.Clear();
					int amount = ListTextures(sc.String, tlist);
					FName texname = sc.String;

					sc.MustGetString();
					int lumpnum = Wads.CheckNumForFullName(sc.String, true, ns_patches);
					if (lumpnum == -1) lumpnum = Wads.CheckNumForFullName(sc.String, true, ns_graphics);

					if (tlist.Size() == 0)
					{
						Printf("Attempting to remap non-existent texture %s to %s\n",
							texname.GetChars(), sc.String);
					}
					else if (lumpnum == -1)
					{
						Printf("Attempting to remap texture %s to non-existent lump %s\n",
							texname.GetChars(), sc.String);
					}
					else
					{
						for(unsigned int i = 0; i < tlist.Size(); i++)
						{
							FTexture * oldtex = Textures[tlist[i].GetIndex()].Texture;
							int sl;

							// only replace matching types. For sprites also replace any MiscPatches
							// based on the same lump. These can be created for icons.
							if (oldtex->UseType == type || type == FTexture::TEX_Any ||
								(mode == TEXMAN_Overridable && oldtex->UseType == FTexture::TEX_Override) ||
								(type == FTexture::TEX_Sprite && oldtex->UseType == FTexture::TEX_MiscPatch &&
								(sl=oldtex->GetSourceLump()) >= 0 && Wads.GetLumpNamespace(sl) == ns_sprites)
								)
							{
								FTexture * newtex = FTexture::CreateTexture (lumpnum, FTexture::TEX_Any);
								if (newtex != NULL)
								{
									// Replace the entire texture and adjust the scaling and offset factors.
									newtex->bWorldPanning = true;
									newtex->SetScaledSize(oldtex->GetScaledWidth(), oldtex->GetScaledHeight());
									newtex->LeftOffset = int(oldtex->GetScaledLeftOffset() * newtex->Scale.X);
									newtex->TopOffset = int(oldtex->GetScaledTopOffset() * newtex->Scale.Y);
									ReplaceTexture(tlist[i], newtex, true);
								}
							}
						}
					}
				}
				else if (sc.Compare("define")) // define a new "fake" texture
				{
					sc.GetString();
					
					FString base = ExtractFileBase(sc.String, false);
					if (!base.IsEmpty())
					{
						src = base.Left(8);

						int lumpnum = Wads.CheckNumForFullName(sc.String, true, ns_patches);
						if (lumpnum == -1) lumpnum = Wads.CheckNumForFullName(sc.String, true, ns_graphics);

						sc.GetString();
						is32bit = !!sc.Compare("force32bit");
						if (!is32bit) sc.UnGet();

						sc.GetNumber();
						width = sc.Number;
						sc.GetNumber();
						height = sc.Number;

						if (lumpnum>=0)
						{
							FTexture *newtex = FTexture::CreateTexture(lumpnum, FTexture::TEX_Override);

							if (newtex != NULL)
							{
								// Replace the entire texture and adjust the scaling and offset factors.
								newtex->bWorldPanning = true;
								newtex->SetScaledSize(width, height);
								newtex->Name = src;

								FTextureID oldtex = TexMan.CheckForTexture(src, FTexture::TEX_MiscPatch);
								if (oldtex.isValid()) 
								{
									ReplaceTexture(oldtex, newtex, true);
									newtex->UseType = FTexture::TEX_Override;
								}
								else AddTexture(newtex);
							}
						}
					}				
					//else Printf("Unable to define hires texture '%s'\n", tex->Name);
				}
				else if (sc.Compare("texture"))
				{
					ParseXTexture(sc, FTexture::TEX_Override);
				}
				else if (sc.Compare("sprite"))
				{
					ParseXTexture(sc, FTexture::TEX_Sprite);
				}
				else if (sc.Compare("walltexture"))
				{
					ParseXTexture(sc, FTexture::TEX_Wall);
				}
				else if (sc.Compare("flat"))
				{
					ParseXTexture(sc, FTexture::TEX_Flat);
				}
				else if (sc.Compare("graphic"))
				{
					ParseXTexture(sc, FTexture::TEX_MiscPatch);
				}
				else
				{
					sc.ScriptError("Texture definition expected, found '%s'", sc.String);
				}
			}
		}
	}
}